

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O2

bool __thiscall LEFReader::parsePin(LEFReader *this)

{
  string *tokstr;
  bool bVar1;
  token_t tVar2;
  ostream *poVar3;
  string endName;
  string name;
  stringstream ss;
  string sStack_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [392];
  
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  bVar1 = parsePinName(this,&local_1d8);
  if (bVar1) {
    if (this->m_curtok == TOK_EOL) {
      poVar3 = std::operator<<((ostream *)&std::cout,"  PIN: ");
      poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
      std::operator<<(poVar3,"\n");
      (*this->_vptr_LEFReader[9])(this,&local_1d8);
      tokstr = &this->m_tokstr;
      do {
        tVar2 = tokenize(this,tokstr);
        this->m_curtok = tVar2;
        if (tVar2 == TOK_IDENT) {
          bVar1 = std::operator==(tokstr,"DIRECTION");
          if (bVar1) {
            parseDirection(this);
          }
          else {
            bVar1 = std::operator==(tokstr,"USE");
            if (bVar1) {
              parseUse(this);
            }
            else {
              bVar1 = std::operator==(tokstr,"PORT");
              if (bVar1) {
                parsePort(this);
              }
              else {
                bVar1 = std::operator==(tokstr,"END");
                if (bVar1) {
                  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                  local_1f8._M_string_length = 0;
                  local_1f8.field_2._M_local_buf[0] = '\0';
                  bVar1 = parsePinName(this,&local_1f8);
                  if (bVar1) {
                    bVar1 = std::operator!=(&local_1f8,&local_1d8);
                    if (bVar1) {
                      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                      poVar3 = std::operator<<((ostream *)(local_1b8 + 0x10),"Expected pin name ");
                      poVar3 = std::operator<<(poVar3,(string *)&local_1f8);
                      std::operator<<(poVar3,"\n");
                      std::__cxx11::stringbuf::str();
                      error(this,&sStack_218);
                      goto LAB_0012616e;
                    }
                    bVar1 = true;
                    if (this->m_curtok != TOK_EOL) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_1b8,"Expected EOL\n",(allocator<char> *)&sStack_218
                                );
                      error(this,(string *)local_1b8);
                      std::__cxx11::string::~string((string *)local_1b8);
                      goto LAB_00126180;
                    }
                  }
                  else {
                    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                    poVar3 = std::operator<<((ostream *)(local_1b8 + 0x10),"Expected pin name ");
                    poVar3 = std::operator<<(poVar3,(string *)&local_1f8);
                    std::operator<<(poVar3,"\n");
                    std::__cxx11::stringbuf::str();
                    error(this,&sStack_218);
LAB_0012616e:
                    std::__cxx11::string::~string((string *)&sStack_218);
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
LAB_00126180:
                    bVar1 = false;
                  }
                  std::__cxx11::string::~string((string *)&local_1f8);
                  goto LAB_00126077;
                }
              }
            }
          }
        }
      } while (((byte)this->m_is[*(long *)(*(long *)this->m_is + -0x18) + 0x20] & 2) == 0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b8,"Unexpected end of file\n",(allocator<char> *)&local_1f8);
      error(this,(string *)local_1b8);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b8,"Expected EOL\n",(allocator<char> *)&local_1f8);
      error(this,(string *)local_1b8);
    }
    std::__cxx11::string::~string((string *)local_1b8);
  }
  bVar1 = false;
LAB_00126077:
  std::__cxx11::string::~string((string *)&local_1d8);
  return bVar1;
}

Assistant:

bool LEFReader::parsePin()
{
    std::string name;
    
    if (!parsePinName(name))
    {
        return false;
    }

    // expect EOL
    if (m_curtok != TOK_EOL)
    {
        error("Expected EOL\n");
        return false;
    }

    std::cout << "  PIN: " << name << "\n";

    onPin(name);

    while(true)
    {
        m_curtok = tokenize(m_tokstr);

        if (m_curtok == TOK_IDENT)
        {
            if (m_tokstr == "DIRECTION")
            {
                parseDirection();
            }
            else if (m_tokstr == "USE")
            {
                parseUse();
            }            
            else if (m_tokstr == "PORT")
            {
                parsePort();
            }
            else if (m_tokstr == "END")
            {
                std::string endName;
                if (!parsePinName(endName))
                {
                    std::stringstream ss;
                    ss << "Expected pin name " << endName << "\n";
                    error(ss.str());
                    return false;
                }

                if (endName != name)
                {
                    std::stringstream ss;
                    ss << "Expected pin name " << endName << "\n";
                    error(ss.str());
                    return false;
                }

                if (m_curtok != TOK_EOL)
                {
                    error("Expected EOL\n");
                    return false;
                }

                return true;
            }           
        }

        if (m_is->eof())
        {
            error("Unexpected end of file\n");
            return false;
        }
    }
}